

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
Belief::InnerProduct
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Belief *this,VectorSet *v
          ,vector<bool,_std::allocator<bool>_> *mask)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  _Bit_type *p_Var3;
  pointer pdVar4;
  pointer pdVar5;
  size_type sVar6;
  pointer pdVar7;
  pointer pdVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  allocator_type local_29;
  value_type_conflict3 local_28;
  
  local_28 = -1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,v->size1_,&local_28,&local_29);
  sVar2 = v->size1_;
  if (sVar2 != 0) {
    p_Var3 = (mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    pdVar4 = (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->_m_b).super_SDV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar6 = v->size2_;
    pdVar8 = (v->data_).data_;
    pdVar7 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      if ((p_Var3[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
        auVar12 = ZEXT864(0) << 0x40;
        dVar11 = 0.0;
        if (pdVar5 != pdVar4) {
          uVar10 = 0;
          do {
            auVar13._8_8_ = 0;
            auVar13._0_8_ = pdVar4[uVar10];
            auVar1._8_8_ = 0;
            auVar1._0_8_ = pdVar8[uVar10];
            auVar1 = vfmadd231sd_fma(auVar12._0_16_,auVar13,auVar1);
            auVar12 = ZEXT1664(auVar1);
            dVar11 = auVar1._0_8_;
            uVar10 = uVar10 + 1;
          } while ((long)pdVar5 - (long)pdVar4 >> 3 != (uVar10 & 0xffffffff));
        }
        pdVar7[uVar9] = dVar11;
      }
      uVar9 = uVar9 + 1;
      pdVar8 = pdVar8 + sVar6;
    } while (sVar2 != (uVar9 & 0xffffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> Belief::InnerProduct(const VectorSet &v,
                                    const vector<bool> &mask) const
{
    vector<double> values(v.size1(),-DBL_MAX);

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        if(mask[k])
        {
            x=0;
            for(unsigned int s=0; s!=_m_b.size(); ++s)
                x+=_m_b[s]*v(k,s);
            values[k]=x;
        }
    }

    return(values);
}